

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeboneProcess.cpp
# Opt level: O3

bool __thiscall Assimp::DeboneProcess::ConsiderMesh(DeboneProcess *this,aiMesh *pMesh)

{
  float fVar1;
  uint uVar2;
  byte bVar3;
  ulong uVar4;
  Logger *this_00;
  uint uVar5;
  ulong uVar6;
  undefined4 uVar7;
  aiBone **ppaVar8;
  ulong uVar9;
  aiBone *paVar10;
  uint uVar11;
  aiFace *paVar12;
  ulong uVar13;
  ulong uVar14;
  bool bVar15;
  vector<unsigned_int,_std::allocator<unsigned_int>_> vertexBones;
  allocator_type local_89;
  DeboneProcess *local_88;
  float local_80;
  value_type_conflict1 local_7c;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_78;
  ulong local_60;
  vector<bool,_std::allocator<bool>_> local_58;
  
  if (pMesh->mNumBones == 0 || pMesh->mBones == (aiBone **)0x0) {
    return false;
  }
  local_78.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start._0_1_ = 0;
  local_88 = this;
  std::vector<bool,_std::allocator<bool>_>::vector
            (&local_58,(ulong)pMesh->mNumBones,(bool *)&local_78,(allocator_type *)&local_7c);
  local_7c = 0xffffffff;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (&local_78,(ulong)pMesh->mNumVertices,&local_7c,&local_89);
  uVar5 = pMesh->mNumBones;
  if (uVar5 != 0) {
    ppaVar8 = pMesh->mBones;
    uVar14 = 0;
    uVar13 = 0;
    do {
      uVar4 = uVar13;
      paVar10 = ppaVar8[uVar14];
      bVar3 = (byte)uVar14;
      if (paVar10->mNumWeights == 0) {
        uVar13 = 1L << (bVar3 & 0x3f);
      }
      else {
        uVar13 = 1L << (bVar3 & 0x3f);
        uVar9 = 0;
        local_60 = uVar4;
        do {
          fVar1 = paVar10->mWeights[uVar9].mWeight;
          if ((fVar1 != 0.0) || (NAN(fVar1))) {
            local_80 = fVar1;
            if (local_88->mThreshold <= fVar1) {
              uVar4 = (ulong)paVar10->mWeights[uVar9].mVertexId;
              uVar6 = (ulong)*(uint *)(CONCAT71(local_78.
                                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                                ._M_impl.super__Vector_impl_data._M_start._1_7_,
                                                local_78.
                                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                                ._M_impl.super__Vector_impl_data._M_start._0_1_) +
                                      uVar4 * 4);
              uVar7 = (int)uVar14;
              if ((uVar6 == 0xffffffff) || (uVar7 = 0xfffffffe, uVar14 != uVar6)) {
                *(undefined4 *)
                 (CONCAT71(local_78.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                           _M_impl.super__Vector_impl_data._M_start._1_7_,
                           local_78.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                           _M_impl.super__Vector_impl_data._M_start._0_1_) + uVar4 * 4) = uVar7;
              }
              else {
                this_00 = DefaultLogger::get();
                Logger::warn(this_00,"Encountered double entry in bone weights");
              }
            }
            uVar4 = local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p[uVar14 >> 6];
            if ((uVar4 & uVar13) == 0) {
              uVar6 = uVar4 | uVar13;
              if (local_88->mThreshold <= local_80) {
                uVar6 = uVar4 & (-2L << (bVar3 & 0x3f) |
                                0xfffffffffffffffeU >> 0x40 - (bVar3 & 0x3f));
              }
              local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
              _M_start.super__Bit_iterator_base._M_p[uVar14 >> 6] = uVar6;
            }
          }
          uVar9 = uVar9 + 1;
          ppaVar8 = pMesh->mBones;
          paVar10 = ppaVar8[uVar14];
        } while (uVar9 < paVar10->mNumWeights);
        uVar5 = pMesh->mNumBones;
        uVar4 = local_60;
      }
      bVar15 = (local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data
                ._M_start.super__Bit_iterator_base._M_p[uVar14 >> 6] & uVar13) == 0;
      uVar14 = uVar14 + 1;
      uVar13 = CONCAT71((int7)(uVar4 >> 8),(byte)uVar4 | bVar15);
    } while (uVar14 < uVar5);
    if (((uVar4 & 1) != 0 || bVar15) && (uVar13 = (ulong)pMesh->mNumFaces, pMesh->mNumFaces != 0)) {
      paVar12 = pMesh->mFaces;
      uVar14 = 0;
      do {
        if (1 < paVar12[uVar14].mNumIndices) {
          uVar5 = *(uint *)(CONCAT71(local_78.
                                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                     ._M_impl.super__Vector_impl_data._M_start._1_7_,
                                     local_78.
                                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                     ._M_impl.super__Vector_impl_data._M_start._0_1_) +
                           (ulong)*paVar12[uVar14].mIndices * 4);
          uVar13 = 1;
          do {
            uVar2 = *(uint *)(CONCAT71(local_78.
                                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                       ._M_impl.super__Vector_impl_data._M_start._1_7_,
                                       local_78.
                                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                       ._M_impl.super__Vector_impl_data._M_start._0_1_) +
                             (ulong)paVar12[uVar14].mIndices[uVar13] * 4);
            if (uVar5 != uVar2) {
              uVar11 = pMesh->mNumBones;
              if (uVar5 < uVar11) {
                local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data
                ._M_start.super__Bit_iterator_base._M_p[uVar5 >> 6] =
                     local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.
                     super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p[uVar5 >> 6] |
                     1L << ((byte)uVar5 & 0x3f);
                uVar11 = pMesh->mNumBones;
              }
              if (uVar2 < uVar11) {
                local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data
                ._M_start.super__Bit_iterator_base._M_p[uVar2 >> 6] =
                     local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.
                     super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p[uVar2 >> 6] |
                     1L << ((byte)uVar2 & 0x3f);
              }
            }
            uVar13 = uVar13 + 1;
            paVar12 = pMesh->mFaces;
          } while (uVar13 < paVar12[uVar14].mNumIndices);
          uVar13 = (ulong)pMesh->mNumFaces;
        }
        uVar14 = uVar14 + 1;
      } while (uVar14 < uVar13);
      uVar5 = pMesh->mNumBones;
    }
    uVar13 = 0;
    if (uVar5 != 0) {
      bVar15 = false;
      do {
        if ((local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
             _M_start.super__Bit_iterator_base._M_p[uVar13 >> 6] >> (uVar13 & 0x3f) & 1) == 0) {
          local_88->mNumBonesCanDoWithout = local_88->mNumBonesCanDoWithout + 1;
          bVar15 = true;
        }
        local_88->mNumBones = local_88->mNumBones + 1;
        uVar5 = (int)uVar13 + 1;
        uVar13 = (ulong)uVar5;
      } while (uVar5 < pMesh->mNumBones);
      goto LAB_0016369d;
    }
  }
  bVar15 = false;
LAB_0016369d:
  if ((void *)CONCAT71(local_78.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                       _M_impl.super__Vector_impl_data._M_start._1_7_,
                       local_78.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                       _M_impl.super__Vector_impl_data._M_start._0_1_) != (void *)0x0) {
    operator_delete((void *)CONCAT71(local_78.
                                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                     ._M_impl.super__Vector_impl_data._M_start._1_7_,
                                     local_78.
                                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                     ._M_impl.super__Vector_impl_data._M_start._0_1_));
  }
  if (local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
      super__Bit_iterator_base._M_p != (_Bit_type *)0x0) {
    operator_delete(local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
  }
  return bVar15;
}

Assistant:

bool DeboneProcess::ConsiderMesh(const aiMesh* pMesh)
{
    if(!pMesh->HasBones()) {
        return false;
    }

    bool split = false;

    //interstitial faces not permitted
    bool isInterstitialRequired = false;

    std::vector<bool> isBoneNecessary(pMesh->mNumBones,false);
    std::vector<unsigned int> vertexBones(pMesh->mNumVertices,UINT_MAX);

    const unsigned int cUnowned = UINT_MAX;
    const unsigned int cCoowned = UINT_MAX-1;

    for(unsigned int i=0;i<pMesh->mNumBones;i++)    {
        for(unsigned int j=0;j<pMesh->mBones[i]->mNumWeights;j++)   {
            float w = pMesh->mBones[i]->mWeights[j].mWeight;

            if(w==0.0f) {
                continue;
            }

            unsigned int vid = pMesh->mBones[i]->mWeights[j].mVertexId;
            if(w>=mThreshold)   {

                if(vertexBones[vid]!=cUnowned)  {
                    if(vertexBones[vid]==i) //double entry
                    {
                        ASSIMP_LOG_WARN("Encountered double entry in bone weights");
                    }
                    else //TODO: track attraction in order to break tie
                    {
                        vertexBones[vid] = cCoowned;
                    }
                }
                else vertexBones[vid] = i;
            }

            if(!isBoneNecessary[i]) {
                isBoneNecessary[i] = w<mThreshold;
            }
        }

        if(!isBoneNecessary[i])  {
            isInterstitialRequired = true;
        }
    }

    if(isInterstitialRequired) {
        for(unsigned int i=0;i<pMesh->mNumFaces;i++) {
            unsigned int v = vertexBones[pMesh->mFaces[i].mIndices[0]];

            for(unsigned int j=1;j<pMesh->mFaces[i].mNumIndices;j++) {
                unsigned int w = vertexBones[pMesh->mFaces[i].mIndices[j]];

                if(v!=w)    {
                    if(v<pMesh->mNumBones) isBoneNecessary[v] = true;
                    if(w<pMesh->mNumBones) isBoneNecessary[w] = true;
                }
            }
        }
    }

    for(unsigned int i=0;i<pMesh->mNumBones;i++)    {
        if(!isBoneNecessary[i]) {
            mNumBonesCanDoWithout++;
            split = true;
        }

        mNumBones++;
    }
    return split;
}